

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

value * __thiscall cppcms::json::value::operator[](value *this,string *name)

{
  variant *this_00;
  _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
  *this_01;
  iterator iVar1;
  void *p;
  pair<std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_bool>
  pVar2;
  value local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  this_00 = &((this->d).d.ptr_)->value_;
  if (this_00->type != is_object) {
    local_48._8_8_ = local_58 + 8;
    local_48._M_allocated_capacity = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = (char *)0x0;
    local_38._8_8_ = 0;
    local_38._M_allocated_capacity = local_48._8_8_;
    variant::destroy(this_00);
    this_00->type = is_object;
    std::
    _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::_Rb_tree((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                *)this_00,
               (_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                *)local_58);
    std::
    _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::~_Rb_tree((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                 *)local_58);
  }
  this_01 = (_Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
             *)variant::
               get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                         (&((this->d).d.ptr_)->value_);
  local_58._0_8_ = (name->_M_dataplus)._M_p;
  local_58._8_8_ = local_58._0_8_ + name->_M_string_length;
  local_48._8_8_ = (_Base_ptr)0x0;
  local_38._M_allocated_capacity = local_38._M_allocated_capacity & 0xffffffffffffff00;
  local_48._M_allocated_capacity = (size_type)&local_38;
  iVar1 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
          ::find((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                  *)this_01,(key_type *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_allocated_capacity != &local_38) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  if (iVar1._M_node == (_Base_ptr)(this_01 + 8)) {
    copyable::copyable(&local_60.d);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
    ::pair<cppcms::json::value,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
                *)local_58,name,&local_60);
    pVar2 = std::
            _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,cppcms::json::value>>
                      (this_01,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
                                *)local_58);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    copyable::~copyable((copyable *)&local_38._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_);
    }
    copyable::~copyable(&local_60.d);
  }
  return (value *)&iVar1._M_node[2]._M_left;
}

Assistant:

value &value::operator[](std::string const &name)
	{
		if(type()!=json::is_object)
			set_value(json::object());

		json::object &self=object();

		json::object::iterator p=self.find(string_key::unowned(name));
		if(p==self.end())
			return self.insert(std::make_pair(name,value())).first->second;
		return p->second;
	}